

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_543c74::Db::parseDecltype(Db *this)

{
  char (*pacVar1) [2];
  char *pcVar2;
  EnclosingExpr *pEVar3;
  char *args_2;
  Node *E;
  Node *local_10;
  
  pacVar1 = (char (*) [2])this->First;
  args_2 = this->Last;
  if (pacVar1 == (char (*) [2])args_2) {
    return (Node *)0x0;
  }
  if ((*pacVar1)[0] == 'D') {
    pcVar2 = *pacVar1 + 1;
    this->First = pcVar2;
    if ((pcVar2 != args_2) && ((*pcVar2 == 't' || (*pcVar2 == 'T')))) {
      this->First = pacVar1[1];
      local_10 = parseExpr(this);
      if ((local_10 != (Node *)0x0) &&
         ((pcVar2 = this->First, pcVar2 != this->Last && (*pcVar2 == 'E')))) {
        this->First = pcVar2 + 1;
        pEVar3 = (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::EnclosingExpr,char_const(&)[10],(anonymous_namespace)::Node*&,char_const(&)[2]>
                           ((Db *)this,(char (*) [10])"decltype(",&local_10,(char (*) [2])args_2);
        return (Node *)pEVar3;
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }